

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbt_pars.cpp
# Opt level: O0

UBool __thiscall icu_63::RuleHalf::isValidOutput(RuleHalf *this,TransliteratorParser *transParser)

{
  UBool UVar1;
  int32_t iVar2;
  uint ch;
  int iVar3;
  int local_24;
  UChar32 c;
  int32_t i;
  TransliteratorParser *transParser_local;
  RuleHalf *this_local;
  
  local_24 = 0;
  do {
    iVar2 = icu_63::UnicodeString::length(&this->text);
    if (iVar2 <= local_24) {
      return '\x01';
    }
    ch = icu_63::UnicodeString::char32At(&this->text,local_24);
    iVar3 = 2;
    if (ch < 0x10000) {
      iVar3 = 1;
    }
    local_24 = iVar3 + local_24;
    UVar1 = ParseData::isReplacer(transParser->parseData,ch);
  } while (UVar1 != '\0');
  return '\0';
}

Assistant:

UBool RuleHalf::isValidOutput(TransliteratorParser& transParser) {
    for (int32_t i=0; i<text.length(); ) {
        UChar32 c = text.char32At(i);
        i += U16_LENGTH(c);
        if (!transParser.parseData->isReplacer(c)) {
            return FALSE;
        }
    }
    return TRUE;
}